

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

string * __thiscall lrit::File::getTime_abi_cxx11_(File *this)

{
  pointer pvVar1;
  size_type __maxsize;
  tm *__tp;
  size_t sVar2;
  string *in_RDI;
  size_t len;
  timespec ts;
  array<char,_128UL> tsbuf;
  File *in_stack_fffffffffffffef0;
  TimeStampHeader *in_stack_ffffffffffffff30;
  timespec local_a0;
  array<char,_128UL> local_90;
  
  getHeader<lrit::TimeStampHeader>(in_stack_fffffffffffffef0);
  local_a0 = TimeStampHeader::getUnix(in_stack_ffffffffffffff30);
  pvVar1 = std::array<char,_128UL>::data((array<char,_128UL> *)0x12727b);
  __maxsize = std::array<char,_128UL>::size(&local_90);
  __tp = gmtime(&local_a0.tv_sec);
  sVar2 = strftime(pvVar1,__maxsize,"%Y%d%m-%H%M%S",__tp);
  pvVar1 = std::array<char,_128UL>::data((array<char,_128UL> *)0x1272c4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pvVar1,sVar2,(allocator *)&stack0xffffffffffffff37);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff37);
  return in_RDI;
}

Assistant:

std::string File::getTime() const {
  std::array<char, 128> tsbuf;
  auto ts = getHeader<lrit::TimeStampHeader>().getUnix();
  auto len = strftime(
    tsbuf.data(),
    tsbuf.size(),
    "%Y%d%m-%H%M%S",
    gmtime(&ts.tv_sec));
  return std::string(tsbuf.data(), len);
}